

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_stress.c
# Opt level: O0

int main(void)

{
  nn_thread cli_threads [10];
  nn_thread srv_thread;
  int i;
  
  nn_thread_init((nn_thread *)&cli_threads[9].handle,server,(void *)0x0);
  for (srv_thread.handle._0_4_ = 0; (int)srv_thread.handle != 10;
      srv_thread.handle._0_4_ = (int)srv_thread.handle + 1) {
    nn_thread_init((nn_thread *)&cli_threads[(long)(int)srv_thread.handle + -1].handle,client,
                   (void *)(long)(int)srv_thread.handle);
  }
  for (srv_thread.handle._0_4_ = 0; (int)srv_thread.handle != 10;
      srv_thread.handle._0_4_ = (int)srv_thread.handle + 1) {
    nn_thread_term((nn_thread *)&cli_threads[(long)(int)srv_thread.handle + -1].handle);
  }
  return 0;
}

Assistant:

int main()
{
    int i;
    struct nn_thread srv_thread;
    struct nn_thread cli_threads[THREAD_COUNT];
    /*  Stress the shutdown algorithm. */
    nn_thread_init(&srv_thread, server, NULL);

    for (i = 0; i != THREAD_COUNT; ++i)
        nn_thread_init(&cli_threads[i], client, (void *)(intptr_t)i);
    for (i = 0; i != THREAD_COUNT; ++i)
        nn_thread_term(&cli_threads[i]);

    return 0;
}